

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

bool __thiscall
Chainstate::ConnectTip
          (Chainstate *this,BlockValidationState *state,CBlockIndex *pindexNew,
          shared_ptr<const_CBlock> *pblock,ConnectTrace *connectTrace,
          DisconnectedBlockTransactions *disconnectpool)

{
  duration *pdVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  uchar *puVar3;
  long lVar4;
  pointer ppCVar5;
  Notifications *pNVar6;
  ValidationSignals *this_00;
  ChainstateManager *pCVar7;
  uint256 *puVar8;
  double dVar9;
  element_type *block;
  bool bVar10;
  bool bVar11;
  long lVar12;
  Logger *pLVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var14;
  long lVar15;
  CCoinsViewCache *baseIn;
  long lVar16;
  Chainstate *pCVar17;
  CBlockIndex *pCVar18;
  char *pcVar19;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view source_file_06;
  shared_ptr<const_CBlock> pblock_00;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  string_view logging_function_06;
  element_type *local_288;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_280;
  shared_ptr<const_CBlock> pthisBlock;
  string local_268;
  char *local_248 [2];
  pointer local_238;
  pointer psStack_230;
  shared_ptr<CBlock> pblockNew;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  CCoinsViewCache view;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  ppCVar5 = (this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppCVar5 ==
      (this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    pCVar18 = (CBlockIndex *)0x0;
  }
  else {
    pCVar18 = ppCVar5[-1];
  }
  if (pindexNew->pprev != pCVar18) {
    __assert_fail("pindexNew->pprev == m_chain.Tip()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0xc3e,
                  "bool Chainstate::ConnectTip(BlockValidationState &, CBlockIndex *, const std::shared_ptr<const CBlock> &, ConnectTrace &, DisconnectedBlockTransactions &)"
                 );
  }
  lVar12 = std::chrono::_V2::steady_clock::now();
  pthisBlock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  pthisBlock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((pblock->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
      (element_type *)0x0) {
    pblockNew.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x80);
    p_Var14->_M_use_count = 1;
    p_Var14->_M_weak_count = 1;
    p_Var14->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_01389cc0;
    *(undefined2 *)((long)&p_Var14[7]._M_use_count + 1) = 0;
    p_Var14[1]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var14[1]._M_use_count = 0;
    p_Var14[1]._M_weak_count = 0;
    p_Var14[2]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var14[2]._M_use_count = 0;
    p_Var14[2]._M_weak_count = 0;
    p_Var14[3]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var14[3]._M_use_count = 0;
    p_Var14[3]._M_weak_count = 0;
    p_Var14[4]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var14[4]._M_use_count = 0;
    p_Var14[4]._M_weak_count = 0;
    p_Var14[5]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var14[5]._M_use_count = 0;
    p_Var14[5]._M_weak_count = 0;
    p_Var14[6]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var14[6]._M_use_count = 0;
    p_Var14[6]._M_weak_count = 0;
    p_Var14[7]._vptr__Sp_counted_base = (_func_int **)0x0;
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::clear((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)(p_Var14 + 6));
    *(undefined2 *)&p_Var14[7]._M_use_count = 0;
    *(undefined1 *)((long)&p_Var14[7]._M_use_count + 2) = 0;
    pblockNew.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (CBlock *)(p_Var14 + 1);
    pblockNew.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var14;
    bVar10 = ::node::BlockManager::ReadBlockFromDisk
                       (this->m_blockman,(CBlock *)(p_Var14 + 1),pindexNew);
    if (bVar10) {
      pthisBlock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           pblockNew.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&pthisBlock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,
                 &pblockNew.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    else {
      pNVar6 = (this->m_chainman->m_options).notifications;
      view.super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView =
           (_func_int **)&view.m_deterministic;
      std::__cxx11::string::_M_construct<char_const*>((string *)&view,"Failed to read block.","");
      pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (view.hashBlock.super_base_blob<256U>.m_data._M_elems + 0xf);
      puVar3 = view.hashBlock.super_base_blob<256U>.m_data._M_elems + 0x1f;
      if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
        view.hashBlock.super_base_blob<256U>.m_data._M_elems._15_8_ = puVar3;
        std::__cxx11::string::_M_construct<char_const*>((string *)pbVar2,"Failed to read block.","")
        ;
      }
      else {
        local_248[0] = "Failed to read block.";
        (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                  (pbVar2,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,local_248);
      }
      (*pNVar6->_vptr_Notifications[8])(pNVar6,&view);
      if ((state->super_ValidationState<BlockValidationResult>).m_mode == M_VALID) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&(state->super_ValidationState<BlockValidationResult>).m_reject_reason,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&view);
      }
      (state->super_ValidationState<BlockValidationResult>).m_mode = M_ERROR;
      if ((uchar *)view.hashBlock.super_base_blob<256U>.m_data._M_elems._15_8_ != puVar3) {
        operator_delete((void *)view.hashBlock.super_base_blob<256U>.m_data._M_elems._15_8_,
                        view._48_8_ + 1);
      }
      if (view.super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView !=
          (_func_int **)&view.m_deterministic) {
        operator_delete(view.super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView,
                        view._16_8_ + 1);
      }
    }
    if (pblockNew.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (pblockNew.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ;
    }
    if (bVar10) goto LAB_00adc21c;
  }
  else {
    pLVar13 = LogInstance();
    bVar10 = BCLog::Logger::WillLogCategoryLevel(pLVar13,BENCH,Debug);
    if (bVar10) {
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
      ;
      source_file._M_len = 0x5e;
      logging_function._M_str = "ConnectTip";
      logging_function._M_len = 10;
      LogPrintFormatInternal<>
                (logging_function,source_file,0xc49,BENCH,Debug,(ConstevalFormatString<0U>)0xfb1f78)
      ;
    }
    pthisBlock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (pblock->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&pthisBlock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &(pblock->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
LAB_00adc21c:
    block = pthisBlock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    lVar15 = std::chrono::_V2::steady_clock::now();
    pLVar13 = LogInstance();
    bVar10 = BCLog::Logger::WillLogCategoryLevel(pLVar13,BENCH,Debug);
    if (bVar10) {
      view.super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView =
           (_func_int **)((double)(lVar15 - lVar12) / 1000000.0);
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
      ;
      source_file_00._M_len = 0x5e;
      logging_function_00._M_str = "ConnectTip";
      logging_function_00._M_len = 10;
      LogPrintFormatInternal<double>
                (logging_function_00,source_file_00,0xc53,BENCH,Debug,
                 (ConstevalFormatString<1U>)0xfb1f90,(double *)&view);
    }
    baseIn = CoinsTip(this);
    CCoinsViewCache::CCoinsViewCache(&view,(CCoinsView *)baseIn,false);
    bVar10 = ConnectBlock(this,block,state,pindexNew,&view,false);
    this_00 = (this->m_chainman->m_options).signals;
    if (this_00 != (ValidationSignals *)0x0) {
      ValidationSignals::BlockChecked(this_00,block,state);
    }
    if (bVar10) {
      lVar16 = std::chrono::_V2::steady_clock::now();
      pCVar7 = this->m_chainman;
      pdVar1 = &pCVar7->time_connect_total;
      pdVar1->__r = pdVar1->__r + (lVar16 - lVar15);
      if (pCVar7->num_blocks_total < 1) {
        __assert_fail("m_chainman.num_blocks_total > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                      ,0xc62,
                      "bool Chainstate::ConnectTip(BlockValidationState &, CBlockIndex *, const std::shared_ptr<const CBlock> &, ConnectTrace &, DisconnectedBlockTransactions &)"
                     );
      }
      pLVar13 = LogInstance();
      bVar11 = BCLog::Logger::WillLogCategoryLevel(pLVar13,BENCH,Debug);
      if (bVar11) {
        pblockNew.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)((double)(lVar16 - lVar15) / 1000000.0);
        dVar9 = (double)(this->m_chainman->time_connect_total).__r;
        local_248[0] = (char *)(dVar9 / 1000000000.0);
        local_268._M_dataplus._M_p =
             (pointer)((dVar9 / 1000000.0) / (double)this->m_chainman->num_blocks_total);
        source_file_01._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
        ;
        source_file_01._M_len = 0x5e;
        logging_function_01._M_str = "ConnectTip";
        logging_function_01._M_len = 10;
        LogPrintFormatInternal<double,double,double>
                  (logging_function_01,source_file_01,0xc66,BENCH,Debug,
                   (ConstevalFormatString<3U>)0xfb1ff2,(double *)&pblockNew,(double *)local_248,
                   (double *)&local_268);
      }
      bVar11 = CCoinsViewCache::Flush(&view);
      if (!bVar11) {
        __assert_fail("flushed",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                      ,0xc68,
                      "bool Chainstate::ConnectTip(BlockValidationState &, CBlockIndex *, const std::shared_ptr<const CBlock> &, ConnectTrace &, DisconnectedBlockTransactions &)"
                     );
      }
    }
    else {
      if ((state->super_ValidationState<BlockValidationResult>).m_mode == M_INVALID) {
        InvalidBlockFound(this,pindexNew,state);
      }
      puVar8 = pindexNew->phashBlock;
      if (puVar8 == (uint256 *)0x0) {
        __assert_fail("phashBlock != nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/chain.h"
                      ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
      }
      local_248[0] = *(char **)(puVar8->super_base_blob<256U>).m_data._M_elems;
      local_248[1] = *(char **)((puVar8->super_base_blob<256U>).m_data._M_elems + 8);
      local_238 = *(pointer *)((puVar8->super_base_blob<256U>).m_data._M_elems + 0x10);
      psStack_230 = *(pointer *)((puVar8->super_base_blob<256U>).m_data._M_elems + 0x18);
      base_blob<256u>::ToString_abi_cxx11_((string *)&pblockNew,local_248);
      ValidationState<BlockValidationResult>::ToString_abi_cxx11_
                (&local_268,&state->super_ValidationState<BlockValidationResult>);
      source_file_02._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
      ;
      source_file_02._M_len = 0x5e;
      logging_function_02._M_str = "ConnectTip";
      logging_function_02._M_len = 10;
      LogPrintFormatInternal<char[11],std::__cxx11::string,std::__cxx11::string>
                (logging_function_02,source_file_02,0xc5d,ALL,Error,
                 (ConstevalFormatString<3U>)0xfb1fb2,(char (*) [11])"ConnectTip",
                 (string *)&pblockNew,&local_268);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pblockNew.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr != &local_210)
      {
        operator_delete(pblockNew.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        local_210._M_allocated_capacity + 1);
      }
      lVar16 = 0;
    }
    view.super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView =
         (_func_int **)&PTR_GetCoin_01398500;
    std::
    _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&view.cacheCoins._M_h);
    if (view.m_sentinel.second.m_flags != '\0') {
      ((view.m_sentinel.second.m_next)->second).m_prev = view.m_sentinel.second.m_prev;
      ((view.m_sentinel.second.m_prev)->second).m_next = view.m_sentinel.second.m_next;
      view.m_sentinel.second.m_flags = '\0';
    }
    if (0x1c < view.m_sentinel.second.coin.out.scriptPubKey.super_CScriptBase._size) {
      free(view.m_sentinel.second.coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.
           indirect);
      view.m_sentinel.second.coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.
      indirect = (char *)0x0;
    }
    PoolResource<144UL,_8UL>::~PoolResource(&view.m_cache_coins_memory_resource);
    if (bVar10) {
      lVar15 = std::chrono::_V2::steady_clock::now();
      pdVar1 = &this->m_chainman->time_flush;
      pdVar1->__r = pdVar1->__r + (lVar15 - lVar16);
      pLVar13 = LogInstance();
      bVar10 = BCLog::Logger::WillLogCategoryLevel(pLVar13,BENCH,Debug);
      if (bVar10) {
        view.super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView =
             (_func_int **)((double)(lVar15 - lVar16) / 1000000.0);
        dVar9 = (double)(this->m_chainman->time_flush).__r;
        pblockNew.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)(dVar9 / 1000000000.0);
        local_248[0] = (char *)((dVar9 / 1000000.0) / (double)this->m_chainman->num_blocks_total);
        source_file_03._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
        ;
        source_file_03._M_len = 0x5e;
        logging_function_03._M_str = "ConnectTip";
        logging_function_03._M_len = 10;
        LogPrintFormatInternal<double,double,double>
                  (logging_function_03,source_file_03,0xc6f,BENCH,Debug,
                   (ConstevalFormatString<3U>)0xfb2022,(double *)&view,(double *)&pblockNew,
                   (double *)local_248);
      }
      pcVar19 = (char *)0x0;
      bVar10 = FlushStateToDisk(this,state,IF_NEEDED,0);
      if (bVar10) {
        lVar16 = std::chrono::_V2::steady_clock::now();
        pdVar1 = &this->m_chainman->time_chainstate;
        pdVar1->__r = pdVar1->__r + (lVar16 - lVar15);
        pLVar13 = LogInstance();
        bVar10 = BCLog::Logger::WillLogCategoryLevel(pLVar13,BENCH,Debug);
        if (bVar10) {
          view.super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView =
               (_func_int **)((double)(lVar16 - lVar15) / 1000000.0);
          dVar9 = (double)(this->m_chainman->time_chainstate).__r;
          pblockNew.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)(dVar9 / 1000000000.0);
          local_248[0] = (char *)((dVar9 / 1000000.0) / (double)this->m_chainman->num_blocks_total);
          source_file_04._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
          ;
          source_file_04._M_len = 0x5e;
          pcVar19 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
          ;
          logging_function_04._M_str = "ConnectTip";
          logging_function_04._M_len = 10;
          LogPrintFormatInternal<double,double,double>
                    (logging_function_04,source_file_04,0xc79,BENCH,Debug,
                     (ConstevalFormatString<3U>)0xfb204a,(double *)&view,(double *)&pblockNew,
                     (double *)local_248);
        }
        if (this->m_mempool != (CTxMemPool *)0x0) {
          CTxMemPool::removeForBlock(this->m_mempool,&block->vtx,pindexNew->nHeight);
          DisconnectedBlockTransactions::removeForBlock(disconnectpool,&block->vtx);
        }
        CChain::SetTip(&this->m_chain,pindexNew);
        UpdateTip(this,pindexNew);
        lVar15 = std::chrono::_V2::steady_clock::now();
        pCVar7 = this->m_chainman;
        pdVar1 = &pCVar7->time_post_connect;
        pdVar1->__r = pdVar1->__r + (lVar15 - lVar16);
        pdVar1 = &pCVar7->time_total;
        pdVar1->__r = pdVar1->__r + (lVar15 - lVar12);
        pLVar13 = LogInstance();
        bVar10 = BCLog::Logger::WillLogCategoryLevel(pLVar13,BENCH,Debug);
        if (bVar10) {
          view.super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView =
               (_func_int **)((double)(lVar15 - lVar16) / 1000000.0);
          dVar9 = (double)(this->m_chainman->time_post_connect).__r;
          pblockNew.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)(dVar9 / 1000000000.0);
          local_248[0] = (char *)((dVar9 / 1000000.0) / (double)this->m_chainman->num_blocks_total);
          source_file_05._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
          ;
          source_file_05._M_len = 0x5e;
          pcVar19 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
          ;
          logging_function_05._M_str = "ConnectTip";
          logging_function_05._M_len = 10;
          LogPrintFormatInternal<double,double,double>
                    (logging_function_05,source_file_05,0xc89,BENCH,Debug,
                     (ConstevalFormatString<3U>)0xfb207f,(double *)&view,(double *)&pblockNew,
                     (double *)local_248);
        }
        pLVar13 = LogInstance();
        bVar10 = BCLog::Logger::WillLogCategoryLevel(pLVar13,BENCH,Debug);
        if (bVar10) {
          view.super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView =
               (_func_int **)((double)(lVar15 - lVar12) / 1000000.0);
          dVar9 = (double)(this->m_chainman->time_total).__r;
          pblockNew.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)(dVar9 / 1000000000.0);
          local_248[0] = (char *)((dVar9 / 1000000.0) / (double)this->m_chainman->num_blocks_total);
          source_file_06._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
          ;
          source_file_06._M_len = 0x5e;
          pcVar19 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
          ;
          logging_function_06._M_str = "ConnectTip";
          logging_function_06._M_len = 10;
          LogPrintFormatInternal<double,double,double>
                    (logging_function_06,source_file_06,0xc8d,BENCH,Debug,
                     (ConstevalFormatString<3U>)0xfb20b5,(double *)&view,(double *)&pblockNew,
                     (double *)local_248);
        }
        pCVar17 = ChainstateManager::ActiveChainstate(this->m_chainman);
        if (pCVar17 != this) {
          ChainstateManager::MaybeCompleteSnapshotValidation(this->m_chainman);
        }
        local_288 = pthisBlock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Stack_280 = pthisBlock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        pthisBlock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        pthisBlock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        pblock_00.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pcVar19;
        pblock_00.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)&local_288;
        ConnectTrace::BlockConnected(connectTrace,pindexNew,pblock_00);
        bVar10 = true;
        if (p_Stack_280 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_280);
        }
        goto LAB_00adc9b5;
      }
    }
  }
  bVar10 = false;
LAB_00adc9b5:
  if (pthisBlock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (pthisBlock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
    return bVar10;
  }
  __stack_chk_fail();
}

Assistant:

bool Chainstate::ConnectTip(BlockValidationState& state, CBlockIndex* pindexNew, const std::shared_ptr<const CBlock>& pblock, ConnectTrace& connectTrace, DisconnectedBlockTransactions& disconnectpool)
{
    AssertLockHeld(cs_main);
    if (m_mempool) AssertLockHeld(m_mempool->cs);

    assert(pindexNew->pprev == m_chain.Tip());
    // Read block from disk.
    const auto time_1{SteadyClock::now()};
    std::shared_ptr<const CBlock> pthisBlock;
    if (!pblock) {
        std::shared_ptr<CBlock> pblockNew = std::make_shared<CBlock>();
        if (!m_blockman.ReadBlockFromDisk(*pblockNew, *pindexNew)) {
            return FatalError(m_chainman.GetNotifications(), state, _("Failed to read block."));
        }
        pthisBlock = pblockNew;
    } else {
        LogDebug(BCLog::BENCH, "  - Using cached block\n");
        pthisBlock = pblock;
    }
    const CBlock& blockConnecting = *pthisBlock;
    // Apply the block atomically to the chain state.
    const auto time_2{SteadyClock::now()};
    SteadyClock::time_point time_3;
    // When adding aggregate statistics in the future, keep in mind that
    // num_blocks_total may be zero until the ConnectBlock() call below.
    LogDebug(BCLog::BENCH, "  - Load block from disk: %.2fms\n",
             Ticks<MillisecondsDouble>(time_2 - time_1));
    {
        CCoinsViewCache view(&CoinsTip());
        bool rv = ConnectBlock(blockConnecting, state, pindexNew, view);
        if (m_chainman.m_options.signals) {
            m_chainman.m_options.signals->BlockChecked(blockConnecting, state);
        }
        if (!rv) {
            if (state.IsInvalid())
                InvalidBlockFound(pindexNew, state);
            LogError("%s: ConnectBlock %s failed, %s\n", __func__, pindexNew->GetBlockHash().ToString(), state.ToString());
            return false;
        }
        time_3 = SteadyClock::now();
        m_chainman.time_connect_total += time_3 - time_2;
        assert(m_chainman.num_blocks_total > 0);
        LogDebug(BCLog::BENCH, "  - Connect total: %.2fms [%.2fs (%.2fms/blk)]\n",
                 Ticks<MillisecondsDouble>(time_3 - time_2),
                 Ticks<SecondsDouble>(m_chainman.time_connect_total),
                 Ticks<MillisecondsDouble>(m_chainman.time_connect_total) / m_chainman.num_blocks_total);
        bool flushed = view.Flush();
        assert(flushed);
    }
    const auto time_4{SteadyClock::now()};
    m_chainman.time_flush += time_4 - time_3;
    LogDebug(BCLog::BENCH, "  - Flush: %.2fms [%.2fs (%.2fms/blk)]\n",
             Ticks<MillisecondsDouble>(time_4 - time_3),
             Ticks<SecondsDouble>(m_chainman.time_flush),
             Ticks<MillisecondsDouble>(m_chainman.time_flush) / m_chainman.num_blocks_total);
    // Write the chain state to disk, if necessary.
    if (!FlushStateToDisk(state, FlushStateMode::IF_NEEDED)) {
        return false;
    }
    const auto time_5{SteadyClock::now()};
    m_chainman.time_chainstate += time_5 - time_4;
    LogDebug(BCLog::BENCH, "  - Writing chainstate: %.2fms [%.2fs (%.2fms/blk)]\n",
             Ticks<MillisecondsDouble>(time_5 - time_4),
             Ticks<SecondsDouble>(m_chainman.time_chainstate),
             Ticks<MillisecondsDouble>(m_chainman.time_chainstate) / m_chainman.num_blocks_total);
    // Remove conflicting transactions from the mempool.;
    if (m_mempool) {
        m_mempool->removeForBlock(blockConnecting.vtx, pindexNew->nHeight);
        disconnectpool.removeForBlock(blockConnecting.vtx);
    }
    // Update m_chain & related variables.
    m_chain.SetTip(*pindexNew);
    UpdateTip(pindexNew);

    const auto time_6{SteadyClock::now()};
    m_chainman.time_post_connect += time_6 - time_5;
    m_chainman.time_total += time_6 - time_1;
    LogDebug(BCLog::BENCH, "  - Connect postprocess: %.2fms [%.2fs (%.2fms/blk)]\n",
             Ticks<MillisecondsDouble>(time_6 - time_5),
             Ticks<SecondsDouble>(m_chainman.time_post_connect),
             Ticks<MillisecondsDouble>(m_chainman.time_post_connect) / m_chainman.num_blocks_total);
    LogDebug(BCLog::BENCH, "- Connect block: %.2fms [%.2fs (%.2fms/blk)]\n",
             Ticks<MillisecondsDouble>(time_6 - time_1),
             Ticks<SecondsDouble>(m_chainman.time_total),
             Ticks<MillisecondsDouble>(m_chainman.time_total) / m_chainman.num_blocks_total);

    // If we are the background validation chainstate, check to see if we are done
    // validating the snapshot (i.e. our tip has reached the snapshot's base block).
    if (this != &m_chainman.ActiveChainstate()) {
        // This call may set `m_disabled`, which is referenced immediately afterwards in
        // ActivateBestChain, so that we stop connecting blocks past the snapshot base.
        m_chainman.MaybeCompleteSnapshotValidation();
    }

    connectTrace.BlockConnected(pindexNew, std::move(pthisBlock));
    return true;
}